

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O0

void __thiscall
bezier::BinomialCoefficients<4UL>::BinomialCoefficients(BinomialCoefficients<4UL> *this)

{
  value_type_conflict vVar1;
  size_t sVar2;
  reference pvVar3;
  undefined8 local_20;
  size_t k;
  size_t center;
  BinomialCoefficients<4UL> *this_local;
  
  memset(this,0,0x28);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    sVar2 = internal::binomial(4,local_20);
    pvVar3 = std::array<unsigned_long,_5UL>::operator[](&this->mCoefficients,local_20);
    *pvVar3 = sVar2;
  }
  for (; local_20 < 5; local_20 = local_20 + 1) {
    pvVar3 = std::array<unsigned_long,_5UL>::operator[](&this->mCoefficients,4 - local_20);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_long,_5UL>::operator[](&this->mCoefficients,local_20);
    *pvVar3 = vVar1;
  }
  return;
}

Assistant:

BinomialCoefficients()
        {
            size_t center = N / 2;
            size_t k = 0;

            while (k <= center)
            {
                mCoefficients[k] = internal::binomial(N, k);
                k++;
            }

            // Utilize the symmetrical nature of the binomial coefficients.
            while (k <= N)
            {
                mCoefficients[k] = mCoefficients[N - k];
                k++;
            }
        }